

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

upb_MessageValue upb_Array_Get(upb_Array *arr,size_t i)

{
  size_t sVar1;
  void *pvVar2;
  byte local_34;
  int lg2;
  char *data;
  size_t i_local;
  upb_Array *arr_local;
  upb_MessageValue ret;
  
  sVar1 = upb_Array_Size(arr);
  if (i < sVar1) {
    pvVar2 = upb_Array_DataPtr(arr);
    sVar1 = _upb_Array_ElemSizeLg2_dont_copy_me__upb_internal_use_only(arr);
    local_34 = (byte)sVar1;
    memcpy(&arr_local,(void *)((long)pvVar2 + (i << (local_34 & 0x3f))),
           (long)(1 << (local_34 & 0x1f)));
    return _arr_local;
  }
  __assert_fail("i < upb_Array_Size(arr)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                ,0x1d,"upb_MessageValue upb_Array_Get(const upb_Array *, size_t)");
}

Assistant:

upb_MessageValue upb_Array_Get(const upb_Array* arr, size_t i) {
  UPB_ASSERT(i < upb_Array_Size(arr));
  upb_MessageValue ret;
  const char* data = upb_Array_DataPtr(arr);
  const int lg2 = UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr);
  memcpy(&ret, data + (i << lg2), 1 << lg2);
  return ret;
}